

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac-sha1.c
# Opt level: O1

void hmac_sha1(uint8_t *key,size_t key_len,uint8_t *message,size_t message_len,uint8_t *digest)

{
  int i;
  long lVar1;
  uint8_t fixed_key [64];
  uint8_t inner_digest [20];
  uint8_t outer_pad [64];
  uint8_t inner_pad [64];
  sha1_ctx ctx;
  byte local_178 [64];
  uint8_t local_138 [32];
  byte local_118 [64];
  byte local_d8 [76];
  sha1_ctx local_8c;
  
  local_178[0] = 0;
  local_178[1] = 0;
  local_178[2] = 0;
  local_178[3] = 0;
  local_178[4] = 0;
  local_178[5] = 0;
  local_178[6] = 0;
  local_178[7] = 0;
  local_178[8] = 0;
  local_178[9] = 0;
  local_178[10] = 0;
  local_178[0xb] = 0;
  local_178[0xc] = 0;
  local_178[0xd] = 0;
  local_178[0xe] = 0;
  local_178[0xf] = 0;
  local_178[0x10] = 0;
  local_178[0x11] = 0;
  local_178[0x12] = 0;
  local_178[0x13] = 0;
  local_178[0x14] = 0;
  local_178[0x15] = 0;
  local_178[0x16] = 0;
  local_178[0x17] = 0;
  local_178[0x18] = 0;
  local_178[0x19] = 0;
  local_178[0x1a] = 0;
  local_178[0x1b] = 0;
  local_178[0x1c] = 0;
  local_178[0x1d] = 0;
  local_178[0x1e] = 0;
  local_178[0x1f] = 0;
  local_178[0x20] = 0;
  local_178[0x21] = 0;
  local_178[0x22] = 0;
  local_178[0x23] = 0;
  local_178[0x24] = 0;
  local_178[0x25] = 0;
  local_178[0x26] = 0;
  local_178[0x27] = 0;
  local_178[0x28] = 0;
  local_178[0x29] = 0;
  local_178[0x2a] = 0;
  local_178[0x2b] = 0;
  local_178[0x2c] = 0;
  local_178[0x2d] = 0;
  local_178[0x2e] = 0;
  local_178[0x2f] = 0;
  local_178[0x30] = 0;
  local_178[0x31] = 0;
  local_178[0x32] = 0;
  local_178[0x33] = 0;
  local_178[0x34] = 0;
  local_178[0x35] = 0;
  local_178[0x36] = 0;
  local_178[0x37] = 0;
  local_178[0x38] = 0;
  local_178[0x39] = 0;
  local_178[0x3a] = 0;
  local_178[0x3b] = 0;
  local_178[0x3c] = 0;
  local_178[0x3d] = 0;
  local_178[0x3e] = 0;
  local_178[0x3f] = 0;
  if (key_len < 0x41) {
    memcpy(local_178,key,key_len);
  }
  else {
    sha1_init(&local_8c);
    sha1_update(&local_8c,key,(uint32_t)key_len);
    sha1_finalise(&local_8c,local_178);
  }
  lVar1 = 0;
  do {
    local_d8[lVar1] = local_178[lVar1] ^ 0x36;
    local_118[lVar1] = local_178[lVar1] ^ 0x5c;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x40);
  sha1_init(&local_8c);
  sha1_update(&local_8c,local_d8,0x40);
  sha1_update(&local_8c,message,(uint32_t)message_len);
  sha1_finalise(&local_8c,local_138);
  sha1_init(&local_8c);
  sha1_update(&local_8c,local_118,0x40);
  sha1_update(&local_8c,local_138,0x14);
  sha1_finalise(&local_8c,digest);
  return;
}

Assistant:

void hmac_sha1(const uint8_t *key, size_t key_len, const uint8_t *message,
               size_t message_len, uint8_t digest[20]) {
  struct sha1_ctx ctx;
  uint8_t fixed_key[64];
  uint8_t inner_digest[20];
  uint8_t inner_pad[64];
  uint8_t outer_pad[64];

  memset(fixed_key, 0, 64);
  if (key_len > 64) {
    sha1_init(&ctx);
    sha1_update(&ctx, (const uint8_t *)key, key_len);
    sha1_finalise(&ctx, fixed_key);
  } else {
    memcpy(fixed_key, key, key_len > 64 ? 64 : key_len);
  }

  for (int i = 0; i < 64; i++) {
    inner_pad[i] = fixed_key[i] ^ 0x36;
    outer_pad[i] = fixed_key[i] ^ 0x5c;
  }

  // perform inner hash
  sha1_init(&ctx);
  sha1_update(&ctx, inner_pad, 64);
  sha1_update(&ctx, message, message_len);
  sha1_finalise(&ctx, inner_digest);

  sha1_init(&ctx);
  sha1_update(&ctx, outer_pad, 64);
  sha1_update(&ctx, inner_digest, 20);
  sha1_finalise(&ctx, digest);
}